

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_score.cc
# Opt level: O3

real_t __thiscall xLearn::FMScore::CalcScore(FMScore *this,SparseRow *row,Model *model,real_t norm)

{
  float *pfVar1;
  float *pfVar2;
  undefined1 (*pauVar3) [16];
  uint uVar4;
  uint uVar5;
  real_t *prVar6;
  float fVar7;
  pointer pNVar8;
  ulong uVar9;
  pointer pNVar10;
  int iVar11;
  uint uVar12;
  ulong __n;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 in_register_00001204 [60];
  undefined1 in_ZMM1 [64];
  undefined1 auVar15 [16];
  undefined1 auVar16 [64];
  undefined1 in_ZMM3 [64];
  undefined1 auVar17 [64];
  vector<float,_std::allocator<float>_> sv;
  allocator_type local_6d;
  real_t local_6c;
  undefined1 local_68 [16];
  value_type_conflict1 local_4c;
  vector<float,_std::allocator<float>_> local_48;
  undefined1 extraout_var [60];
  
  auVar15 = in_ZMM3._0_16_;
  auVar14 = in_ZMM1._0_16_;
  auVar16._4_60_ = in_register_00001204;
  auVar16._0_4_ = norm;
  local_68._0_4_ = norm;
  if (norm < 0.0) {
    auVar17._0_4_ = sqrtf(norm);
    auVar17._4_60_ = extraout_var;
    auVar13 = auVar17._0_16_;
  }
  else {
    auVar13 = vsqrtss_avx(auVar16._0_16_,auVar16._0_16_);
  }
  auVar16 = ZEXT1664(ZEXT816(0) << 0x40);
  auVar14 = vcvtusi2ss_avx512f(auVar14,model->aux_size_);
  uVar4 = model->num_feat_;
  pNVar8 = (row->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pNVar10 = (row->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  iVar11 = vcvttss2usi_avx512f(auVar14);
  if (pNVar8 != pNVar10) {
    do {
      if (pNVar8->feat_id < uVar4) {
        auVar14 = vfmadd231ss_fma(auVar16._0_16_,auVar13,
                                  ZEXT416((uint)(pNVar8->feat_val *
                                                model->param_w_[pNVar8->feat_id * iVar11])));
        auVar16 = ZEXT1664(auVar14);
      }
      pNVar8 = pNVar8 + 1;
    } while (pNVar8 != pNVar10);
  }
  local_6c = *model->param_b_;
  auVar14 = vcvtusi2ss_avx512f(auVar15,model->num_K_);
  local_4c = 0.0;
  auVar14 = ZEXT416((uint)(auVar14._0_4_ * 0.25));
  auVar14 = vroundss_avx(auVar14,auVar14,10);
  uVar12 = vcvttss2usi_avx512f(auVar14);
  __n = (ulong)(uVar12 * 4);
  std::vector<float,_std::allocator<float>_>::vector(&local_48,__n,&local_4c,&local_6d);
  pNVar8 = (row->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pNVar10 = (row->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  if (pNVar8 == pNVar10) {
    auVar14 = SUB6416(ZEXT864(0),0);
  }
  else {
    iVar11 = uVar12 * 4 * iVar11;
    do {
      uVar5 = pNVar8->feat_id;
      if ((uVar5 < uVar4) && (__n != 0)) {
        fVar7 = (float)local_68._0_4_ * pNVar8->feat_val;
        uVar9 = 0;
        prVar6 = model->param_v_;
        do {
          pfVar1 = prVar6 + uVar5 * iVar11 + uVar9;
          pfVar2 = local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start + uVar9;
          auVar14._0_4_ = fVar7 * *pfVar1 + *pfVar2;
          auVar14._4_4_ = fVar7 * pfVar1[1] + pfVar2[1];
          auVar14._8_4_ = fVar7 * pfVar1[2] + pfVar2[2];
          auVar14._12_4_ = fVar7 * pfVar1[3] + pfVar2[3];
          *(undefined1 (*) [16])
           (local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start + uVar9) = auVar14;
          uVar9 = uVar9 + 4;
        } while (uVar9 < __n);
        pNVar10 = (row->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
      }
      pNVar8 = pNVar8 + 1;
    } while (pNVar8 != pNVar10);
    pNVar8 = (row->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (pNVar8 == pNVar10) {
      auVar14 = SUB6416(ZEXT864(0),0);
    }
    else {
      auVar17 = ZEXT864(0);
      do {
        if ((pNVar8->feat_id < uVar4) && ((uVar12 & 0x3fffffff) != 0)) {
          fVar7 = (float)local_68._0_4_ * pNVar8->feat_val;
          uVar9 = 0;
          do {
            pfVar1 = model->param_v_ + pNVar8->feat_id * iVar11 + uVar9;
            auVar15._0_4_ = fVar7 * *pfVar1;
            auVar15._4_4_ = fVar7 * pfVar1[1];
            auVar15._8_4_ = fVar7 * pfVar1[2];
            auVar15._12_4_ = fVar7 * pfVar1[3];
            pauVar3 = (undefined1 (*) [16])
                      (local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start + uVar9);
            uVar9 = uVar9 + 4;
            auVar14 = vsubps_avx(*pauVar3,auVar15);
            auVar17 = ZEXT1664(CONCAT412(auVar17._12_4_ + auVar15._12_4_ * auVar14._12_4_,
                                         CONCAT48(auVar17._8_4_ + auVar15._8_4_ * auVar14._8_4_,
                                                  CONCAT44(auVar17._4_4_ +
                                                           auVar15._4_4_ * auVar14._4_4_,
                                                           auVar17._0_4_ +
                                                           auVar15._0_4_ * auVar14._0_4_))));
          } while (uVar9 < __n);
        }
        pNVar8 = pNVar8 + 1;
        auVar14 = auVar17._0_16_;
      } while (pNVar8 != pNVar10);
    }
  }
  local_68 = auVar14;
  if (local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  auVar14 = vhaddps_avx(local_68,local_68);
  auVar14 = vhaddps_avx(auVar14,auVar14);
  return auVar16._0_4_ + local_6c + auVar14._0_4_ * 0.5;
}

Assistant:

real_t FMScore::CalcScore(const SparseRow* row,
                          Model& model,
                          real_t norm) {
  /*********************************************************
   *  linear term and bias term                            *
   *********************************************************/
  real_t sqrt_norm = sqrt(norm);
  real_t *w = model.GetParameter_w();
  index_t num_feat = model.GetNumFeature();
  real_t t = 0;
  index_t aux_size = model.GetAuxiliarySize();
  for (SparseRow::const_iterator iter = row->begin();
       iter != row->end(); ++iter) {
    index_t feat_id = iter->feat_id;
    // To avoid unseen feature in Prediction
    if (feat_id >= num_feat) continue;
    t += (iter->feat_val * w[feat_id*aux_size] * sqrt_norm);
  }
  // bias
  w = model.GetParameter_b();
  t += w[0];
  /*********************************************************
   *  latent factor                                        *
   *********************************************************/
  index_t aligned_k = model.get_aligned_k();
  index_t align0 = model.get_aligned_k() * aux_size;
  std::vector<real_t> sv(aligned_k, 0);
  real_t* s = sv.data();
  for (SparseRow::const_iterator iter = row->begin();
       iter != row->end(); ++iter) {
    index_t j1 = iter->feat_id;
    // To avoid unseen feature in Prediction
    if (j1 >= num_feat) continue;
    real_t v1 = iter->feat_val;
    real_t *w = model.GetParameter_v() + j1 * align0;
    __m128 XMMv = _mm_set1_ps(v1*norm);
    for (index_t d = 0; d < aligned_k; d += kAlign) {
      __m128 XMMs = _mm_load_ps(s+d);
      __m128 const XMMw = _mm_load_ps(w+d);
      XMMs = _mm_add_ps(XMMs, _mm_mul_ps(XMMw, XMMv));
      _mm_store_ps(s+d, XMMs);
    }
  }
  __m128 XMMt = _mm_set1_ps(0.0f);
  for (SparseRow::const_iterator iter = row->begin();
       iter != row->end(); ++iter) {
    index_t j1 = iter->feat_id;
    // To avoid unseen feature in Prediction
    if (j1 >= num_feat) continue;
    real_t v1 = iter->feat_val;
    real_t *w = model.GetParameter_v() + j1 * align0;
    __m128 XMMv = _mm_set1_ps(v1*norm);
    for (index_t d = 0; d < aligned_k; d += kAlign) {
      __m128 XMMs = _mm_load_ps(s+d);
      __m128 XMMw = _mm_load_ps(w+d);
      __m128 XMMwv = _mm_mul_ps(XMMw, XMMv);
      XMMt = _mm_add_ps(XMMt,
         _mm_mul_ps(XMMwv, _mm_sub_ps(XMMs, XMMwv)));
    }
  }
  XMMt = _mm_hadd_ps(XMMt, XMMt);
  XMMt = _mm_hadd_ps(XMMt, XMMt);
  real_t t_all;
  _mm_store_ss(&t_all, XMMt);
  t_all *= 0.5;
  t_all += t;
  return t_all;
}